

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O2

void __thiscall
nestl::impl::detail::
rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
::m_move_data(void *this,long x)

{
  long lVar1;
  
  lVar1 = *(long *)(x + 0x20);
  *(long *)((long)this + 0x20) = lVar1;
  *(undefined8 *)((long)this + 0x28) = *(undefined8 *)(x + 0x28);
  *(undefined8 *)((long)this + 0x30) = *(undefined8 *)(x + 0x30);
  *(long *)(lVar1 + 8) = (long)this + 0x18;
  *(undefined8 *)(x + 0x20) = 0;
  *(long *)(x + 0x28) = x + 0x18;
  *(long *)(x + 0x30) = x + 0x18;
  *(undefined8 *)((long)this + 0x38) = *(undefined8 *)(x + 0x38);
  *(undefined8 *)(x + 0x38) = 0;
  return;
}

Assistant:

void
rb_tree<Key, Val, KeyOfValue, Compare, Alloc>::m_move_data(rb_tree& x, std::true_type) NESTL_NOEXCEPT_SPEC
{
    m_root() = x.m_root();
    m_leftmost() = x.m_leftmost();
    m_rightmost() = x.m_rightmost();
    m_root()->m_parent = m_end();

    x.m_root() = 0;
    x.m_leftmost() = x.m_end();
    x.m_rightmost() = x.m_end();

    this->m_impl.m_node_count = x.m_impl.m_node_count;
    x.m_impl.m_node_count = 0;
}